

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cVertexAttrib64BitTest.cpp
# Opt level: O0

GLdouble VertexAttrib64Bit::Base::RandomDouble(GLdouble min,GLdouble max)

{
  uint uVar1;
  GLdouble range;
  GLdouble fraction;
  GLdouble max_local;
  GLdouble min_local;
  
  uVar1 = (uint)RandomDouble::value;
  if (RandomDouble::value < 0x2000) {
    RandomDouble::value = RandomDouble::value + 1;
  }
  else {
    RandomDouble::value = 0;
  }
  return ((double)uVar1 / 8192.0) * (max - min) + min;
}

Assistant:

GLdouble Base::RandomDouble(GLdouble min, GLdouble max)
{
	static const glw::GLushort max_value = 0x2000;
	static glw::GLushort	   value	 = 0x1234;

	GLdouble	   fraction = ((GLdouble)value) / ((GLdouble)max_value);
	const GLdouble range	= max - min;

	value = static_cast<glw::GLushort>((max_value <= value) ? 0 : value + 1);

	return min + fraction * range;
}